

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZipArchiveIOSystem.cpp
# Opt level: O3

size_t __thiscall Assimp::ZipFile::Read(ZipFile *this,void *pvBuffer,size_t pSize,size_t pCount)

{
  uchar *puVar1;
  size_t sVar2;
  size_t __n;
  
  puVar1 = (this->m_Buffer)._M_t.
           super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
           super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
  if (puVar1 == (uchar *)0x0) {
    __assert_fail("m_Buffer != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Common/ZipArchiveIOSystem.cpp"
                  ,0xfe,"virtual size_t Assimp::ZipFile::Read(void *, size_t, size_t)");
  }
  if (((pvBuffer != (void *)0x0) && (pSize != 0)) && (pCount != 0)) {
    __n = pCount * pSize;
    sVar2 = this->m_SeekPtr;
    if (this->m_Size < sVar2 + __n) {
      pCount = (this->m_Size - sVar2) / pSize;
      __n = pCount * pSize;
      if (__n == 0) {
        return 0;
      }
    }
    memcpy(pvBuffer,puVar1 + sVar2,__n);
    this->m_SeekPtr = this->m_SeekPtr + __n;
    return pCount;
  }
  __assert_fail("__null != pvBuffer && 0 != pSize && 0 != pCount",
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Common/ZipArchiveIOSystem.cpp"
                ,0xff,"virtual size_t Assimp::ZipFile::Read(void *, size_t, size_t)");
}

Assistant:

size_t ZipFile::Read(void* pvBuffer, size_t pSize, size_t pCount) {
        // Should be impossible
        ai_assert(m_Buffer != nullptr);
        ai_assert(NULL != pvBuffer && 0 != pSize && 0 != pCount);

        // Clip down to file size
        size_t byteSize = pSize * pCount;
        if ((byteSize + m_SeekPtr) > m_Size)
        {
            pCount = (m_Size - m_SeekPtr) / pSize;
            byteSize = pSize * pCount;
            if (byteSize == 0)
                return 0;
        }

        std::memcpy(pvBuffer, m_Buffer.get() + m_SeekPtr, byteSize);

        m_SeekPtr += byteSize;

        return pCount;
    }